

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

string * __thiscall CSubNet::ToString_abi_cxx11_(string *__return_storage_ptr__,CSubNet *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  uchar uVar5;
  long in_FS_OFFSET;
  string suffix;
  uchar local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((this->network).m_net - NET_IPV4 < 2) {
    uVar1 = (this->network).m_addr._size;
    uVar2 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    if (0x10 < uVar2) {
      __assert_fail("network.m_addr.size() <= sizeof(netmask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x420,"std::string CSubNet::ToString() const");
    }
    uVar5 = '\0';
    for (uVar4 = 0; (uVar2 != uVar4 && (this->netmask[uVar4] != '\0')); uVar4 = uVar4 + 1) {
      iVar3 = NetmaskBits(this->netmask[uVar4]);
      uVar5 = uVar5 + (char)iVar3;
    }
    local_71 = uVar5;
    tinyformat::format<unsigned_char>(&local_70,"/%u",&local_71);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  CNetAddr::ToStringAddr_abi_cxx11_(&local_70,&this->network);
  std::operator+(__return_storage_ptr__,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CSubNet::ToString() const
{
    std::string suffix;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6: {
        assert(network.m_addr.size() <= sizeof(netmask));

        uint8_t cidr = 0;

        for (size_t i = 0; i < network.m_addr.size(); ++i) {
            if (netmask[i] == 0x00) {
                break;
            }
            cidr += NetmaskBits(netmask[i]);
        }

        suffix = strprintf("/%u", cidr);
        break;
    }
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        break;
    }

    return network.ToStringAddr() + suffix;
}